

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O0

int testInvalidUpdatableModelNonUpdatableLayers(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  WeightParams *pWVar3;
  ostream *poVar4;
  Result local_b0;
  InnerProductLayerParams *innerProductParams;
  NeuralNetworkLayer *innerProductLayer;
  NeuralNetwork *nn;
  ArrayFeatureType *type_out;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)out,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  type_out = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)type_out,"probs");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)type_out);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::set_datatype
            ((ArrayFeatureType *)nn,ArrayFeatureType_ArrayDataType_INT32);
  CoreML::Specification::Model::set_isupdatable((Model *)&topIn,true);
  CoreML::Specification::Model::set_specificationversion((Model *)&topIn,4);
  innerProductLayer =
       (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  innerProductParams =
       (InnerProductLayerParams *)
       CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)innerProductLayer);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)innerProductParams,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)innerProductParams,"probs");
  local_b0.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::NeuralNetworkLayer::mutable_innerproduct
                 ((NeuralNetworkLayer *)innerProductParams);
  CoreML::Specification::InnerProductLayerParams::set_inputchannels
            ((InnerProductLayerParams *)local_b0.m_message._M_storage._M_storage,1);
  CoreML::Specification::InnerProductLayerParams::set_outputchannels
            ((InnerProductLayerParams *)local_b0.m_message._M_storage._M_storage,1);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_weights
                     ((InnerProductLayerParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  CoreML::Specification::InnerProductLayerParams::set_hasbias
            ((InnerProductLayerParams *)local_b0.m_message._M_storage._M_storage,true);
  pWVar3 = CoreML::Specification::InnerProductLayerParams::mutable_bias
                     ((InnerProductLayerParams *)local_b0.m_message._M_storage._M_storage);
  CoreML::Specification::WeightParams::add_floatvalue(pWVar3,1.0);
  CoreML::Model::validate(&local_b0,(Model *)&topIn);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_b0);
  if (m1._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0xf0);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_b0);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m1._oneof_case_[0];
}

Assistant:

int testInvalidUpdatableModelNonUpdatableLayers() {

    /*
     checks that updatable property is true for atleast one layer if a model is updatable.
     */

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("probs");
    auto *type_out = out->mutable_type()->mutable_multiarraytype();
    type_out->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);

    m1.set_isupdatable(true);
    m1.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    const auto nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *innerProductLayer = nn->add_layers();

    innerProductLayer->add_input("input");
    innerProductLayer->add_output("probs");

    Specification::InnerProductLayerParams *innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(1);
    innerProductParams->set_outputchannels(1);

    innerProductParams->mutable_weights()->add_floatvalue(1.0);

    innerProductParams->set_hasbias(true);
    innerProductParams->mutable_bias()->add_floatvalue(1.0);

    Result res = Model::validate(m1);

    ML_ASSERT_BAD(res);
    return 0;
}